

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O0

void __thiscall TiXmlText::Print(TiXmlText *this,FILE *cfile,int depth)

{
  char *pcVar1;
  TiXmlString local_28;
  TiXmlString buffer;
  int i;
  int depth_local;
  FILE *cfile_local;
  TiXmlText *this_local;
  
  buffer.rep_._4_4_ = depth;
  if (cfile != (FILE *)0x0) {
    if ((this->cdata & 1U) == 0) {
      TiXmlString::TiXmlString(&local_28);
      TiXmlBase::EncodeString(&(this->super_TiXmlNode).value,&local_28);
      pcVar1 = TiXmlString::c_str(&local_28);
      fprintf((FILE *)cfile,"%s",pcVar1);
      TiXmlString::~TiXmlString(&local_28);
    }
    else {
      fprintf((FILE *)cfile,"\n");
      for (buffer.rep_._0_4_ = 0; (int)buffer.rep_ < buffer.rep_._4_4_;
          buffer.rep_._0_4_ = (int)buffer.rep_ + 1) {
        fprintf((FILE *)cfile,"    ");
      }
      pcVar1 = TiXmlString::c_str(&(this->super_TiXmlNode).value);
      fprintf((FILE *)cfile,"<![CDATA[%s]]>\n",pcVar1);
    }
    return;
  }
  __assert_fail("cfile",
                "/workspace/llm4binary/github/license_all_cmakelists_25/LiangLin0316[P]HZRobot/Include/xml/Source/tinyxml.cpp"
                ,0x536,"virtual void TiXmlText::Print(FILE *, int) const");
}

Assistant:

void TiXmlText::Print( FILE* cfile, int depth ) const
{
	assert( cfile );
	if ( cdata )
	{
		int i;
		fprintf( cfile, "\n" );
		for ( i=0; i<depth; i++ ) {
			fprintf( cfile, "    " );
		}
		fprintf( cfile, "<![CDATA[%s]]>\n", value.c_str() );	// unformatted output
	}
	else
	{
		TIXML_STRING buffer;
		EncodeString( value, &buffer );
		fprintf( cfile, "%s", buffer.c_str() );
	}
}